

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char16_t *
fmt::v8::detail::
parse_align<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>
          (char16_t *begin,char16_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *handler)

{
  char16_t cVar1;
  align_t align;
  type tVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  bool bVar5;
  basic_string_view<char16_t> fill;
  
  if (begin == end) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8e2,"");
  }
  pcVar3 = begin + 1;
  pcVar4 = begin;
  if (pcVar3 < end) {
    pcVar4 = pcVar3;
  }
  do {
    cVar1 = *pcVar4;
    if (cVar1 == L'^') {
      align = center;
LAB_00196f7c:
      if ((long)pcVar4 - (long)begin != 0) {
        if (*begin == L'{') {
          fmt::v8::detail::throw_format_error("invalid fill character \'{\'");
        }
        tVar2 = to_unsigned<long>((long)pcVar4 - (long)begin >> 1);
        fill.size_ = tVar2;
        fill.data_ = begin;
        specs_setter<char16_t>::on_fill((specs_setter<char16_t> *)handler,fill);
        pcVar3 = pcVar4 + 1;
      }
      specs_checker<fmt::v8::detail::specs_handler<char16_t>_>::on_align(handler,align);
      return pcVar3;
    }
    if (cVar1 == L'>') {
      align = right;
      goto LAB_00196f7c;
    }
    if (cVar1 == L'<') {
      align = left;
      goto LAB_00196f7c;
    }
    bVar5 = pcVar4 == begin;
    pcVar4 = begin;
    if (bVar5) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}